

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOFX.c
# Opt level: O3

uint32_t FAPOFX_CreateFXWithCustomAllocatorEXT
                   (FAudioGUID *clsid,FAPO **pEffect,void *pInitData,uint32_t InitDataByteSize,
                   FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
                   FAudioReallocFunc customRealloc)

{
  int iVar1;
  uint32_t uVar2;
  uint8_t uVar3;
  
  iVar1 = SDL_memcmp(clsid,&FAPOFX_CLSID_FXEQ,0x10);
  if (iVar1 == 0) {
    uVar3 = '\0';
  }
  else {
    iVar1 = SDL_memcmp(clsid,&FAPOFX_CLSID_FXEQ_LEGACY,0x10);
    if (iVar1 != 0) {
      iVar1 = SDL_memcmp(clsid,&FAPOFX_CLSID_FXMasteringLimiter,0x10);
      if (iVar1 == 0) {
        uVar3 = '\0';
      }
      else {
        iVar1 = SDL_memcmp(clsid,&FAPOFX_CLSID_FXMasteringLimiter_LEGACY,0x10);
        if (iVar1 != 0) {
          iVar1 = SDL_memcmp(clsid,&FAPOFX_CLSID_FXReverb,0x10);
          if (iVar1 == 0) {
            uVar3 = '\0';
          }
          else {
            iVar1 = SDL_memcmp(clsid,&FAPOFX_CLSID_FXReverb_LEGACY,0x10);
            if (iVar1 != 0) {
              iVar1 = SDL_memcmp(clsid,&FAPOFX_CLSID_FXEcho,0x10);
              if (iVar1 == 0) {
                uVar3 = '\0';
              }
              else {
                iVar1 = SDL_memcmp(clsid,&FAPOFX_CLSID_FXEcho_LEGACY,0x10);
                if (iVar1 != 0) {
                  return 0xffffffff;
                }
                uVar3 = '\x01';
              }
              uVar2 = FAPOFXCreateEcho(pEffect,pInitData,InitDataByteSize,customMalloc,customFree,
                                       customRealloc,uVar3);
              return uVar2;
            }
            uVar3 = '\x01';
          }
          uVar2 = FAPOFXCreateReverb(pEffect,pInitData,InitDataByteSize,customMalloc,customFree,
                                     customRealloc,uVar3);
          return uVar2;
        }
        uVar3 = '\x01';
      }
      uVar2 = FAPOFXCreateMasteringLimiter
                        (pEffect,pInitData,InitDataByteSize,customMalloc,customFree,customRealloc,
                         uVar3);
      return uVar2;
    }
    uVar3 = '\x01';
  }
  uVar2 = FAPOFXCreateEQ(pEffect,pInitData,InitDataByteSize,customMalloc,customFree,customRealloc,
                         uVar3);
  return uVar2;
}

Assistant:

uint32_t FAPOFX_CreateFXWithCustomAllocatorEXT(
	const FAudioGUID *clsid,
	FAPO **pEffect,
	const void *pInitData,
	uint32_t InitDataByteSize,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc
) {
	#define CHECK_AND_RETURN(effect) \
		if (FAudio_memcmp(clsid, &FAPOFX_CLSID_FX##effect, sizeof(FAudioGUID)) == 0) \
		{ \
			return FAPOFXCreate##effect( \
				pEffect, \
				pInitData, \
				InitDataByteSize, \
				customMalloc, \
				customFree, \
				customRealloc, \
				0 \
			); \
		} \
		else if (FAudio_memcmp(clsid, &FAPOFX_CLSID_FX##effect##_LEGACY, sizeof(FAudioGUID)) == 0) \
		{ \
			return FAPOFXCreate##effect( \
				pEffect, \
				pInitData, \
				InitDataByteSize, \
				customMalloc, \
				customFree, \
				customRealloc, \
				1 \
			); \
		}
	CHECK_AND_RETURN(EQ)
	CHECK_AND_RETURN(MasteringLimiter)
	CHECK_AND_RETURN(Reverb)
	CHECK_AND_RETURN(Echo)
	#undef CHECK_AND_RETURN
	return -1;
}